

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O0

void __thiscall FIX::HttpServer::onStart(HttpServer *this)

{
  SocketServer *this_00;
  HttpServer *in_RSI;
  bool local_19;
  HttpServer *this_local;
  
  do {
    local_19 = false;
    if (((this->m_stop & 1U) == 0) && (local_19 = false, this->m_pServer != (SocketServer *)0x0)) {
      in_RSI = this;
      local_19 = SocketServer::block(this->m_pServer,&this->super_Strategy,false,0.0);
    }
  } while (local_19 != false);
  if (this->m_pServer != (SocketServer *)0x0) {
    SocketServer::close(this->m_pServer,(int)in_RSI);
    this_00 = this->m_pServer;
    if (this_00 != (SocketServer *)0x0) {
      SocketServer::~SocketServer(this_00);
      operator_delete(this_00,0x160);
    }
    this->m_pServer = (SocketServer *)0x0;
  }
  return;
}

Assistant:

void HttpServer::onStart() {
  while (!m_stop && m_pServer && m_pServer->block(*this)) {}

  if (!m_pServer) {
    return;
  }

  m_pServer->close();
  delete m_pServer;
  m_pServer = 0;
}